

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O2

_Bool ValidateMagicF(FILE *file,uint8_t *expected_magic,size_t magic_len)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  void *__ptr;
  size_t sVar3;
  _Bool _Var4;
  
  __ptr = malloc(magic_len);
  if (__ptr == (void *)0x0) {
    LPWarn("","(%s) Couldn\'t malloc our magic","ValidateMagicF");
  }
  else {
    fread(__ptr,1,magic_len,(FILE *)file);
    sVar3 = 0;
    do {
      if (magic_len == sVar3) {
        _Var4 = true;
        goto LAB_0010173e;
      }
      puVar1 = (uint8_t *)((long)__ptr + sVar3);
      puVar2 = expected_magic + sVar3;
      sVar3 = sVar3 + 1;
    } while (*puVar1 == *puVar2);
    LPDebug("","(%s) %d != %d","ValidateMagicF");
  }
  fclose((FILE *)file);
  _Var4 = false;
LAB_0010173e:
  free(__ptr);
  return _Var4;
}

Assistant:

bool
ValidateMagicF(FILE *file, const uint8_t *expected_magic, const size_t magic_len)
{
	bool rv = true;

	uint8_t *our_magic = malloc(magic_len);
	if (!our_magic) {
		LPWarn("", "(%s) Couldn't malloc our magic", __func__);
		fclose(file);
		rv = false;
		goto done;
	}

	fread(our_magic, 1, magic_len, file);

	for (int i = 0; i < magic_len; i++) {
		if (our_magic[i] != expected_magic[i]) {
			LPDebug("", "(%s) %d != %d", __func__, our_magic[i], expected_magic[i]);
			fclose(file);
			rv = false;
			goto done;
		}
	}

done:
	free(our_magic);
	return rv;
}